

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O2

bool google::InitVLOG3__(SiteFlag *site_flag,int32 *level_default,char *fname,int32 verbose_level)

{
  undefined8 *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ulong str_len;
  long *plVar8;
  int *piVar9;
  undefined1 local_80 [8];
  string pattern;
  undefined4 local_48;
  int32 local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  char local_31;
  
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)vmodule_lock);
  local_31 = inited_vmodule;
  if (inited_vmodule == '\0') {
    inited_vmodule = 0;
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pcVar6 = (char *)*fLS::FLAGS_vmodule_abi_cxx11_;
    pattern.field_2._8_8_ = site_flag;
    local_44 = verbose_level;
    do {
      pcVar5 = strchr(pcVar6,0x3d);
      if (pcVar5 == (char *)0x0) break;
      local_80 = (undefined1  [8])&pattern._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,pcVar6,pcVar5);
      iVar4 = __isoc99_sscanf(pcVar5,"=%d",&local_48);
      this = pbVar7;
      pbVar2 = local_40;
      if (iVar4 == 1) {
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x30);
        (this->_M_dataplus)._M_p = (pointer)&this->field_2;
        this->_M_string_length = 0;
        (this->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80);
        *(undefined4 *)&this[1]._M_dataplus._M_p = local_48;
        pbVar2 = this;
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pbVar7[1]._M_string_length = (size_type)this;
          pbVar2 = local_40;
        }
      }
      local_40 = pbVar2;
      pbVar7 = this;
      pcVar5 = strchr(pcVar5,0x2c);
      pcVar6 = pcVar5 + 1;
      std::__cxx11::string::~string((string *)local_80);
    } while (pcVar5 != (char *)0x0);
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar7[1]._M_string_length = (size_type)vmodule_list;
      vmodule_list = local_40;
    }
    inited_vmodule = '\x01';
    site_flag = (SiteFlag *)pattern.field_2._8_8_;
    verbose_level = local_44;
  }
  pcVar5 = strrchr(fname,0x2f);
  pcVar6 = pcVar5 + 1;
  if (pcVar5 == (char *)0x0) {
    pcVar6 = fname;
  }
  pcVar5 = strchr(pcVar6,0x2e);
  if (pcVar5 == (char *)0x0) {
    str_len = strlen(pcVar6);
  }
  else {
    str_len = (long)pcVar5 - (long)pcVar6;
  }
  if ((3 < str_len) && (*(int *)(pcVar6 + (str_len - 4)) == 0x6c6e692d)) {
    str_len = str_len - 4;
  }
  plVar8 = (long *)&vmodule_list;
  do {
    puVar1 = (undefined8 *)*plVar8;
    piVar9 = level_default;
    if (puVar1 == (undefined8 *)0x0) {
LAB_0011d434:
      if (((local_31 != '\0') && (site_flag->level = piVar9, piVar9 == level_default)) &&
         (site_flag->base_name == (char *)0x0)) {
        site_flag->base_name = pcVar6;
        site_flag->base_len = str_len;
        site_flag->next = cached_site_list;
        cached_site_list = site_flag;
      }
      iVar4 = *piVar9;
      ::glog_internal_namespace_::Mutex::Unlock((Mutex *)vmodule_lock);
      return verbose_level <= iVar4;
    }
    bVar3 = glog_internal_namespace_::SafeFNMatch_((char *)*puVar1,puVar1[1],pcVar6,str_len);
    if (bVar3) {
      piVar9 = (int *)(puVar1 + 4);
      goto LAB_0011d434;
    }
    plVar8 = puVar1 + 5;
  } while( true );
}

Assistant:

bool InitVLOG3__(SiteFlag* site_flag, int32* level_default,
                 const char* fname, int32 verbose_level) {
  MutexLock l(&vmodule_lock);
  bool read_vmodule_flag = inited_vmodule;
  if (!read_vmodule_flag) {
    VLOG2Initializer();
  }

  // protect the errno global in case someone writes:
  // VLOG(..) << "The last error was " << strerror(errno)
  int old_errno = errno;

  // site_default normally points to FLAGS_v
  int32* site_flag_value = level_default;

  // Get basename for file
  const char* base = strrchr(fname, '/');

#ifdef _WIN32
  if (!base) {
    base = strrchr(fname, '\\');
  }
#endif

  base = base ? (base+1) : fname;
  const char* base_end = strchr(base, '.');
  size_t base_length = base_end ? size_t(base_end - base) : strlen(base);

  // Trim out trailing "-inl" if any
  if (base_length >= 4 && (memcmp(base+base_length-4, "-inl", 4) == 0)) {
    base_length -= 4;
  }

  // TODO: Trim out _unittest suffix?  Perhaps it is better to have
  // the extra control and just leave it there.

  // find target in vector of modules, replace site_flag_value with
  // a module-specific verbose level, if any.
  for (const VModuleInfo* info = vmodule_list;
       info != NULL; info = info->next) {
    if (SafeFNMatch_(info->module_pattern.c_str(), info->module_pattern.size(),
                     base, base_length)) {
      site_flag_value = &info->vlog_level;
        // value at info->vlog_level is now what controls
        // the VLOG at the caller site forever
      break;
    }
  }

  // Cache the vlog value pointer if --vmodule flag has been parsed.
  ANNOTATE_BENIGN_RACE(site_flag,
                       "*site_flag may be written by several threads,"
                       " but the value will be the same");
  if (read_vmodule_flag) {
    site_flag->level = site_flag_value;
    // If VLOG flag has been cached to the default site pointer,
    // we want to add to the cached list in order to invalidate in case
    // SetVModule is called afterwards with new modules.
    // The performance penalty here is neglible, because InitVLOG3__ is called
    // once per site.
    if (site_flag_value == level_default && !site_flag->base_name) {
      site_flag->base_name = base;
      site_flag->base_len = base_length;
      site_flag->next = cached_site_list;
      cached_site_list = site_flag;
    }
  }

  // restore the errno in case something recoverable went wrong during
  // the initialization of the VLOG mechanism (see above note "protect the..")
  errno = old_errno;
  return *site_flag_value >= verbose_level;
}